

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512bf16.cpp
# Opt level: O2

void ncnn::cast_fp32_to_bf16_sse_avx512bf16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  
  iVar1 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
  uVar3 = 0;
  uVar2 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pauVar4 = (undefined1 (*) [64])
              (bottom_blob->cstep * uVar3 * bottom_blob->elemsize + (long)bottom_blob->data);
    pauVar5 = (undefined1 (*) [64])
              (top_blob->cstep * uVar3 * top_blob->elemsize + (long)top_blob->data);
    for (iVar6 = 0; iVar6 + 0x1f < iVar1; iVar6 = iVar6 + 0x20) {
      auVar9 = vcvtneps2bf16_avx512f(*pauVar4);
      auVar10 = vcvtneps2bf16_avx512f(pauVar4[1]);
      auVar11 = vinsertf64x4_avx512f(ZEXT3264(auVar9),auVar10,1);
      *pauVar5 = auVar11;
      pauVar4 = pauVar4 + 2;
      pauVar5 = pauVar5 + 1;
    }
    for (; iVar6 + 0xf < iVar1; iVar6 = iVar6 + 0x10) {
      auVar9 = vcvtneps2bf16_avx512f(*pauVar4);
      *(undefined1 (*) [32])*pauVar5 = auVar9;
      pauVar4 = pauVar4 + 1;
      pauVar5 = (undefined1 (*) [64])((long)*pauVar5 + 0x20);
    }
    for (; iVar6 + 7 < iVar1; iVar6 = iVar6 + 8) {
      auVar8 = vcvtneps2bf16_avx512vl(*(undefined1 (*) [32])*pauVar4);
      *(undefined1 (*) [16])*pauVar5 = auVar8;
      pauVar4 = (undefined1 (*) [64])(*pauVar4 + 0x20);
      pauVar5 = (undefined1 (*) [64])((long)*pauVar5 + 0x10);
    }
    lVar7 = 0;
    for (; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      *(undefined2 *)((long)*pauVar5 + lVar7 * 2) = *(undefined2 *)(*pauVar4 + lVar7 * 4 + 2);
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void cast_bf16_to_fp32_sse_avx512bf16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
}